

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O1

bool __thiscall HPreData::isZeroA(HPreData *this,int i,int j)

{
  long lVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  lVar6 = (long)i;
  piVar3 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar3[lVar6];
  lVar8 = (long)iVar2;
  iVar7 = iVar2;
  if (piVar4[lVar8] != j) {
    iVar7 = piVar3[lVar6 + 1];
    if (piVar3[lVar6 + 1] < iVar2) {
      iVar7 = iVar2;
    }
    lVar9 = 0;
    do {
      if (iVar7 - lVar8 == lVar9) goto LAB_0014c102;
      lVar1 = lVar9 + 1;
      lVar5 = lVar9 + 1;
      lVar9 = lVar1;
    } while (piVar4[lVar8 + lVar5] != j);
    iVar7 = iVar2 + (int)lVar1;
  }
LAB_0014c102:
  return iVar7 == piVar3[lVar6 + 1];
}

Assistant:

bool HPreData::isZeroA(int i, int j) {
	int k=ARstart[i];
    while (j != ARindex[k] && k<ARstart[i+1])
            k++;
    if (k==ARstart[i+1]) {
    	return true;
    	}
    return false;
}